

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

void duckdb::ReadDataFromPrimitiveSegment<unsigned_int>
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ushort uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ulong uVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ListSegment *pLVar10;
  idx_t iVar11;
  ulong uVar12;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  uVar6 = segment->count;
  if (uVar6 != 0) {
    pLVar10 = segment + 1;
    local_40 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar12 = 0;
    do {
      if (*(char *)((long)&segment[1].count + uVar12) == '\x01') {
        iVar11 = *total_count;
        _Var9._M_head_impl =
             (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var5 = p_Stack_50;
          peVar4 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar4;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var5;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var9._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
          uVar6 = segment->count;
        }
        bVar3 = (byte)(iVar11 + uVar12) & 0x3f;
        _Var9._M_head_impl[iVar11 + uVar12 >> 6] =
             _Var9._M_head_impl[iVar11 + uVar12 >> 6] &
             (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar12 = uVar12 + 1;
      uVar8 = (ulong)uVar6;
    } while (uVar12 < uVar8);
    if (uVar6 != 0) {
      pdVar1 = result->data;
      puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      iVar11 = *total_count;
      do {
        if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0))
        {
          *(undefined4 *)(pdVar1 + iVar11 * 4) =
               *(undefined4 *)((long)&pLVar10->count + (ulong)segment->capacity);
        }
        pLVar10 = (ListSegment *)&pLVar10->field_0x4;
        iVar11 = iVar11 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return;
}

Assistant:

static void ReadDataFromPrimitiveSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                         idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto aggr_vector_data = FlatVector::GetData<T>(result);

	// load values
	for (idx_t i = 0; i < segment->count; i++) {
		if (aggr_vector_validity.RowIsValid(total_count + i)) {
			auto data = GetPrimitiveData<T>(segment);
			aggr_vector_data[total_count + i] = Load<T>(const_data_ptr_cast(data + i));
		}
	}
}